

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O1

double __thiscall
lineage::heuristics::PartitionGraph::move(PartitionGraph *this,size_t v,size_t targetPartition)

{
  vector<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  *this_00;
  pointer *ppEVar1;
  pointer puVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  undefined8 *puVar5;
  pointer puVar6;
  pointer pVVar7;
  _Bit_type *p_Var8;
  iterator iVar9;
  bool bVar10;
  ulong uVar11;
  pointer pRVar12;
  Data *pDVar13;
  ostream *poVar14;
  runtime_error *prVar15;
  _Elt_pointer puVar16;
  _Hash_node_base *p_Var17;
  ulong uVar18;
  ProblemGraph *pPVar19;
  __node_base *p_Var20;
  pointer pAVar21;
  difference_type __d;
  ulong uVar22;
  long lVar23;
  pointer pAVar24;
  char cVar25;
  size_t previousBranchingEdge;
  vector<bool,_std::allocator<bool>_> visited;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  double local_c8;
  ulong local_c0;
  _Hash_node_base *local_b8;
  vector<bool,_std::allocator<bool>_> local_b0;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  long local_38;
  
  puVar2 = (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_b8 = (_Hash_node_base *)v;
  if (v < (ulong)((long)(this->vertexLabels_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
    uVar3 = puVar2[v];
    lVar23 = uVar3 * 0x38;
    if (2 < (this->partitions_).
            super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar3]._M_h._M_element_count) {
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                (&local_88,0);
      p_Var20 = &(this->partitions_).
                 super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3]._M_h._M_before_begin;
      do {
        p_Var20 = p_Var20->_M_nxt;
        if (p_Var20 == (__node_base *)0x0) goto LAB_0013dcf4;
      } while (p_Var20[1]._M_nxt == local_b8);
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<unsigned_long,std::allocator<unsigned_long>>::
        _M_push_back_aux<unsigned_long_const&>
                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                   (unsigned_long *)(p_Var20 + 1));
      }
      else {
        *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (unsigned_long)p_Var20[1]._M_nxt
        ;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
LAB_0013dcf4:
      local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._8_8_ =
           (ulong)(uint)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ << 0x20;
      local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      pPVar19 = this->data_->problemGraph;
      local_38 = lVar23;
      std::vector<bool,_std::allocator<bool>_>::resize
                (&local_b0,
                 (long)(pPVar19->graph_).vertices_.
                       super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pPVar19->graph_).vertices_.
                       super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,false);
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          puVar16 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
            puVar16 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          uVar18 = puVar16[-1];
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          uVar22 = uVar18 + 0x3f;
          if (-1 < (long)uVar18) {
            uVar22 = uVar18;
          }
          local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar22 >> 6) + ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)]
               = local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar22 >> 6) +
                  ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                 1L << ((byte)uVar18 & 0x3f);
          pRVar12 = (this->data_->problemGraph->graph_).vertices_.
                    super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (pAVar24 = *(pointer *)&pRVar12[uVar18].vector_;
              pAVar24 != *(pointer *)((long)(pRVar12 + uVar18) + 8); pAVar24 = pAVar24 + 1) {
            p_Var4 = (_Hash_node_base *)pAVar24->vertex_;
            if (p_Var4 != local_b8) {
              p_Var17 = (_Hash_node_base *)((long)&p_Var4[7]._M_nxt + 7);
              if (-1 < (long)p_Var4) {
                p_Var17 = p_Var4;
              }
              if (((local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)p_Var17 >> 6) +
                     ((ulong)(((ulong)p_Var4 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                    ((ulong)p_Var4 & 0x3f) & 1) == 0) &&
                 ((this->vertexLabels_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)p_Var4] == uVar3)) {
                local_c0 = pAVar24->vertex_;
                std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>
                          ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
                           &local_c0);
              }
            }
            pRVar12 = (this->data_->problemGraph->graph_).vertices_.
                      super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
        } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      lVar23 = local_38;
      for (puVar5 = *(undefined8 **)
                     ((long)&(((this->partitions_).
                               super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_h)._M_before_begin.
                             _M_nxt + local_38); puVar5 != (undefined8 *)0x0;
          puVar5 = (undefined8 *)*puVar5) {
        p_Var4 = (_Hash_node_base *)puVar5[1];
        cVar25 = '\v';
        if (p_Var4 != local_b8) {
          p_Var17 = (_Hash_node_base *)((long)&p_Var4[7]._M_nxt + 7);
          if (-1 < (long)p_Var4) {
            p_Var17 = p_Var4;
          }
          cVar25 = (local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)p_Var17 >> 6) +
                     ((ulong)(((ulong)p_Var4 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                    ((ulong)p_Var4 & 0x3f) & 1) == 0;
        }
        if ((cVar25 != '\v') && (cVar25 != '\0')) goto LAB_0013df15;
      }
      cVar25 = '\n';
LAB_0013df15:
      if (local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ =
             local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_88);
      if ((cVar25 != '\0') && (cVar25 != '\n')) {
        return INFINITY;
      }
    }
    puVar6 = (this->partitions_).
             super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar18 = ((long)(this->partitions_).
                    super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3) *
             0x6db6db6db6db6db7;
    if (targetPartition <= uVar18 && uVar18 - targetPartition != 0) {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((long)&(puVar6->_M_h)._M_buckets + lVar23),&local_b8);
      local_88._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           ((this->partitions_).
            super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + targetPartition);
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_88._M_impl.super__Deque_impl_data._M_map,&local_b8,&local_88);
      (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[(long)local_b8] = targetPartition;
      local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (unsigned_long *)0x0;
      pDVar13 = this->data_;
      pPVar19 = pDVar13->problemGraph;
      pRVar12 = (pPVar19->graph_).vertices_.
                super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar24 = *(pointer *)&pRVar12[(long)local_b8].vector_;
      if (pAVar24 == *(pointer *)((long)(pRVar12 + (long)local_b8) + 8)) {
        local_c8 = 0.0;
      }
      else {
        this_00 = &(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_;
        local_c8 = 0.0;
        do {
          lVar23 = (long)(pPVar19->problem_->nodes).
                         super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (*(int *)(lVar23 + (long)local_b8 * 0x18) == *(int *)(lVar23 + pAVar24->vertex_ * 0x18)
             ) {
            uVar18 = (this->vertexLabels_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[pAVar24->vertex_];
            if (uVar18 == uVar3) {
              local_c8 = local_c8 +
                         (pDVar13->costs).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[pAVar24->edge_];
            }
            else if (uVar18 == targetPartition) {
              local_c8 = local_c8 -
                         (pDVar13->costs).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[pAVar24->edge_];
            }
          }
          else {
            lVar23 = (long)(pDVar13->problemGraph->problem_->nodes).
                           super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl
                           .super__Vector_impl_data._M_start;
            pVVar7 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                     vertices_.
                     super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (this->vertexLabels_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar18 = puVar2[pAVar24->vertex_];
            if (*(uint *)(lVar23 + (long)local_b8 * 0x18) <
                *(uint *)(lVar23 + pAVar24->vertex_ * 0x18)) {
              pAVar21 = *(pointer *)&((Adjacencies *)((long)(pVVar7 + uVar3) + 0x20))->vector_;
              uVar22 = (long)*(pointer *)((long)(pVVar7 + uVar3) + 0x28) - (long)pAVar21 >> 4;
              while (uVar11 = uVar22, 0 < (long)uVar11) {
                uVar22 = uVar11 >> 1;
                if (pAVar21[uVar22].vertex_ < uVar18) {
                  pAVar21 = pAVar21 + uVar22 + 1;
                  uVar22 = ~uVar22 + uVar11;
                }
              }
              if ((*(pointer *)((long)(pVVar7 + uVar3) + 0x28) == pAVar21) ||
                 (pAVar21->vertex_ != uVar18)) {
                bVar10 = false;
                uVar18 = 0;
              }
              else {
                uVar18 = pAVar21->edge_;
                bVar10 = true;
              }
              if (!bVar10) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," w=",3);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                std::endl<char,std::char_traits<char>>(poVar14);
                prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar15,"Inconsistent edges!");
                __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              uVar22 = puVar2[pAVar24->vertex_];
              local_c0 = uVar18;
              if ((this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                  multipleEdgesEnabled_ != true) {
                pAVar21 = *(pointer *)
                           &((Adjacencies *)((long)(pVVar7 + targetPartition) + 0x20))->vector_;
                uVar18 = (long)*(pointer *)((long)(pVVar7 + targetPartition) + 0x28) - (long)pAVar21
                         >> 4;
                while (uVar11 = uVar18, 0 < (long)uVar11) {
                  uVar18 = uVar11 >> 1;
                  if (pAVar21[uVar18].vertex_ < uVar22) {
                    pAVar21 = pAVar21 + uVar18 + 1;
                    uVar18 = ~uVar18 + uVar11;
                  }
                }
                if ((*(pointer *)((long)(pVVar7 + targetPartition) + 0x28) == pAVar21) ||
                   (pAVar21->vertex_ != uVar22)) {
                  bVar10 = false;
                  uVar18 = 0;
                }
                else {
                  uVar18 = pAVar21->edge_;
                  bVar10 = true;
                }
                if (bVar10) goto LAB_0013e31b;
              }
              iVar9._M_current =
                   (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                   super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)targetPartition;
              local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._8_8_ = uVar22;
              if (iVar9._M_current ==
                  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                ::_M_realloc_insert<andres::graph::detail::Edge<true,unsigned_long>>
                          ((vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                            *)this_00,iVar9,(Edge<true,_unsigned_long> *)&local_b0);
              }
              else {
                (iVar9._M_current)->vertexIndices_[0] = targetPartition;
                (iVar9._M_current)->vertexIndices_[1] = uVar22;
                ppEVar1 = &(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                           edges_.
                           super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppEVar1 = *ppEVar1 + 1;
              }
              uVar18 = ((long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>)
                              .edges_.
                              super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>)
                              .edges_.
                              super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
              andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
              insertAdjacenciesForEdge
                        (&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
                         uVar18);
            }
            else {
              pAVar21 = *(pointer *)&((Adjacencies *)((long)(pVVar7 + uVar18) + 0x20))->vector_;
              uVar22 = (long)*(pointer *)((long)(pVVar7 + uVar18) + 0x28) - (long)pAVar21 >> 4;
              while (uVar11 = uVar22, 0 < (long)uVar11) {
                uVar22 = uVar11 >> 1;
                if (pAVar21[uVar22].vertex_ < uVar3) {
                  pAVar21 = pAVar21 + uVar22 + 1;
                  uVar22 = ~uVar22 + uVar11;
                }
              }
              if ((*(pointer *)((long)(pVVar7 + uVar18) + 0x28) == pAVar21) ||
                 (pAVar21->vertex_ != uVar3)) {
                bVar10 = false;
                uVar18 = 0;
              }
              else {
                uVar18 = pAVar21->edge_;
                bVar10 = true;
              }
              if (!bVar10) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Error log: edge with v=",0x17);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,", w=",4);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"not found!",10);
                std::endl<char,std::char_traits<char>>(poVar14);
                prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar15,"Inconsistent edges!");
                __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              p_Var8 = (_Bit_type *)puVar2[pAVar24->vertex_];
              local_c0 = uVar18;
              if ((this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                  multipleEdgesEnabled_ != true) {
                pAVar21 = *(pointer *)
                           &((Adjacencies *)((long)(pVVar7 + (long)p_Var8) + 0x20))->vector_;
                uVar18 = (long)*(pointer *)((long)(pVVar7 + (long)p_Var8) + 0x28) - (long)pAVar21 >>
                         4;
                while (uVar22 = uVar18, 0 < (long)uVar22) {
                  uVar18 = uVar22 >> 1;
                  if (pAVar21[uVar18].vertex_ < targetPartition) {
                    pAVar21 = pAVar21 + uVar18 + 1;
                    uVar18 = ~uVar18 + uVar22;
                  }
                }
                if ((*(pointer *)((long)(pVVar7 + (long)p_Var8) + 0x28) == pAVar21) ||
                   (pAVar21->vertex_ != targetPartition)) {
                  bVar10 = false;
                  uVar18 = 0;
                }
                else {
                  uVar18 = pAVar21->edge_;
                  bVar10 = true;
                }
                if (bVar10) goto LAB_0013e31b;
              }
              iVar9._M_current =
                   (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                   super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p = p_Var8;
              local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._8_8_ = targetPartition;
              if (iVar9._M_current ==
                  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                ::_M_realloc_insert<andres::graph::detail::Edge<true,unsigned_long>>
                          ((vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                            *)this_00,iVar9,(Edge<true,_unsigned_long> *)&local_b0);
              }
              else {
                (iVar9._M_current)->vertexIndices_[0] = (Value)p_Var8;
                (iVar9._M_current)->vertexIndices_[1] = targetPartition;
                ppEVar1 = &(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                           edges_.
                           super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppEVar1 = *ppEVar1 + 1;
              }
              uVar18 = ((long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>)
                              .edges_.
                              super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>)
                              .edges_.
                              super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
              andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
              insertAdjacenciesForEdge
                        (&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
                         uVar18);
            }
LAB_0013e31b:
            updateEdgeCost(this,uVar18,
                           -(this->data_->costs).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start[pAVar24->edge_]);
            updateEdgeCost(this,local_c0,
                           (this->data_->costs).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[pAVar24->edge_]);
            if ((_Elt_pointer)local_88._M_impl.super__Deque_impl_data._M_map_size ==
                local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                         (iterator)local_88._M_impl.super__Deque_impl_data._M_map_size,&local_c0);
            }
            else {
              *(ulong *)local_88._M_impl.super__Deque_impl_data._M_map_size = local_c0;
              local_88._M_impl.super__Deque_impl_data._M_map_size =
                   local_88._M_impl.super__Deque_impl_data._M_map_size + 8;
            }
          }
          pAVar24 = pAVar24 + 1;
          pDVar13 = this->data_;
          pPVar19 = pDVar13->problemGraph;
        } while (pAVar24 !=
                 *(pointer *)
                  ((long)((pPVar19->graph_).vertices_.
                          super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_b8) + 8));
      }
      removeVanishedEdges<std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88);
      if (local_88._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_map,
                        (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur -
                        (long)local_88._M_impl.super__Deque_impl_data._M_map);
      }
      return local_c8;
    }
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar15,"Partition does not exist!");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Node: ",6);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::endl<char,std::char_traits<char>>(poVar14);
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar15,"Failed to move. Node doesnt exist!");
  }
  __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double move(const size_t v, const size_t targetPartition)
    {
        if (v >= vertexLabels_.size()) {
            std::cerr << "Node: " << v << std::endl;
            throw std::runtime_error("Failed to move. Node doesnt exist!");
        }
        const size_t previousPartition = vertexLabels_[v];

        // make sure moving the node doesnt split the partition.
        if (partitions_[previousPartition].size() > 2) {

            std::stack<size_t> stack;

            for (auto it = partitions_[previousPartition].cbegin();
                 it != partitions_[previousPartition].cend(); ++it) {
                if (*it != v) {
                    stack.push(*it);
                    break;
                }
            }

            std::vector<bool> visited;
            visited.resize(this->data_.problemGraph.graph().numberOfVertices(),
                           false);

            while (!stack.empty()) {
                const auto w = stack.top();
                stack.pop();

                visited[w] = true;

                for (auto it = this->data_.problemGraph.graph()
                                   .adjacenciesFromVertexBegin(w);
                     it !=
                     this->data_.problemGraph.graph().adjacenciesFromVertexEnd(
                         w);
                     ++it) {
                    if (it->vertex() == v)
                        continue;
                    if (visited[it->vertex()])
                        continue;
                    if (vertexLabels_[it->vertex()] == previousPartition)
                        stack.push(it->vertex());
                }
            }

            for (const auto& w : partitions_[previousPartition]) {
                if (w == v) {
                    continue;
                }

                // if it would break a partition, then dont move.
                if (!visited[w]) {
                    return std::numeric_limits<double>::infinity();
                }
            }
        }

        if (targetPartition >= partitions_.size())
            throw std::runtime_error("Partition does not exist!");

        // move the node v to the same partition w.
        partitions_[previousPartition].erase(v);
        partitions_[targetPartition].insert(v);
        vertexLabels_[v] = targetPartition;

        // calculate objective change in-plane and update costs for
        // the branching.
        auto objectiveChange = .0;
        std::vector<size_t> buffer;
        for (auto it =
                 this->data_.problemGraph.graph().adjacenciesFromVertexBegin(v);
             it != this->data_.problemGraph.graph().adjacenciesFromVertexEnd(v);
             ++it) {

            // in-frame.
            if (this->data_.problemGraph.frameOfNode(v) ==
                this->data_.problemGraph.frameOfNode(it->vertex())) {

                // (v, it->vertex) becomes a cut edge.
                if (vertexLabels_[it->vertex()] == previousPartition) {
                    objectiveChange += this->data_.costs[it->edge()];

                    // (v, it->vertex) becomes an internal edge.
                } else if (vertexLabels_[it->vertex()] == targetPartition) {
                    objectiveChange -= this->data_.costs[it->edge()];
                }

            } else { // inter-frame.
                size_t previousBranchingEdge, newBranchingEdge;

                if (this->data_.problemGraph.frameOfNode(v) <
                    this->data_.problemGraph.frameOfNode(it->vertex())) {

                    const auto p = this->findEdge(previousPartition,
                                                  vertexLabels_[it->vertex()]);
                    if (!p.first) {
                        std::cerr << "v=" << previousPartition
                                  << " w=" << vertexLabels_[it->vertex()]
                                  << std::endl;
                        throw std::runtime_error("Inconsistent edges!");
                    }
                    previousBranchingEdge = p.second;
                    newBranchingEdge = this->insertEdge(
                        targetPartition, vertexLabels_[it->vertex()]);
                } else {
                    const auto p = this->findEdge(vertexLabels_[it->vertex()],
                                                  previousPartition);
                    if (!p.first) {
                        std::cerr
                            << "Error log: edge with v=" << previousPartition
                            << ", w=" << vertexLabels_[it->vertex()]
                            << "not found!" << std::endl;
                        throw std::runtime_error("Inconsistent edges!");
                    }
                    previousBranchingEdge = p.second;
                    newBranchingEdge = this->insertEdge(
                        vertexLabels_[it->vertex()], targetPartition);
                }

                updateEdgeCost(newBranchingEdge,
                               -this->data_.costs[it->edge()]);
                updateEdgeCost(previousBranchingEdge,
                               this->data_.costs[it->edge()]);

                // we will only need to check branching edges where the
                // contributing edge of v was removed whether they vanished.
                buffer.emplace_back(previousBranchingEdge);
            }
        }

        // check if we have to remove edges.
        removeVanishedEdges(buffer);

        return objectiveChange;
    }